

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  char *local_978;
  int local_970;
  undefined1 local_968 [7];
  char key;
  Mat local_950 [8];
  Mat disp_img;
  _InputArray local_8f0;
  allocator<char> local_8d1;
  string local_8d0 [32];
  _InputArray local_8b0;
  Size_<int> local_898;
  _OutputArray local_890;
  _InputArray local_878;
  Mat local_860 [8];
  Mat small_img;
  Scalar_<double> local_800;
  _InputArray local_7e0;
  _InputArray local_7c8;
  _OutputArray local_7b0;
  _InputArray local_798;
  Scalar_<double> local_780;
  _InputArray local_760;
  _InputArray local_748;
  _OutputArray local_730;
  _InputArray local_718;
  Scalar_<double> local_700;
  _InputArray local_6e0;
  _InputArray local_6c8;
  _OutputArray local_6b0;
  _InputArray local_698;
  _OutputArray local_680;
  Rect_<int> local_668;
  _OutputArray local_658 [4];
  _OutputArray local_5f8;
  Rect_<int> local_5e0;
  _OutputArray local_5d0 [4];
  Mat local_570 [8];
  Mat rect_imgr;
  Mat local_510 [8];
  Mat rect_imgl;
  Mat local_4b0 [8];
  Mat raw_imgr;
  Mat local_450 [8];
  Mat raw_imgl;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [8];
  string disp_win_name;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [8];
  string param_win_name;
  char win_name [256];
  string local_180 [32];
  string local_160 [96];
  VideoCapture local_100 [8];
  VideoCapture vcapture;
  undefined1 local_d0 [8];
  Mat raw_img;
  string local_70;
  allocator<char> local_39;
  string local_38 [8];
  string file_name;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    local_978 = argv[1];
  }
  else {
    local_978 = "../astar_calicam.yml";
  }
  file_name.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,local_978,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&local_70,local_38);
  LoadParameters(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  InitRectifyMap();
  cv::Mat::Mat((Mat *)local_d0);
  cv::VideoCapture::VideoCapture(local_100);
  if ((live & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_180,"../dasl_wood_shop.jpg",(allocator<char> *)(win_name + 0xff));
    cv::imread(local_160,(int)local_180);
    cv::Mat::operator=((Mat *)local_d0,(Mat *)local_160);
    cv::Mat::~Mat((Mat *)local_160);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)(win_name + 0xff));
  }
  else {
    cv::VideoCapture::open((int)local_100,0);
    bVar1 = cv::VideoCapture::isOpened();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Camera doesn\'t work");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    cv::VideoCapture::set((int)local_100,(double)cap_cols);
    cv::VideoCapture::set((int)local_100,(double)cap_rows);
    cv::VideoCapture::set((int)local_100,30.0);
  }
  sprintf(param_win_name.field_2._M_local_buf + 8,"Raw Image: %d x %d",(ulong)(uint)img_width,
          (ulong)(uint)cap_rows);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,param_win_name.field_2._M_local_buf + 8,&local_2a9);
  std::allocator<char>::~allocator(&local_2a9);
  cv::namedWindow(local_2a8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"V. FoV:  60    +",&local_2d1);
  cv::createTrackbar(local_2d0,local_2a8,(int *)0x0,vfov_max,OnTrackAngle,(void *)0x0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"Width:  480 +",&local_2f9);
  cv::createTrackbar(local_2f8,local_2a8,(int *)0x0,width_max,OnTrackWidth,(void *)0x0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"Height: 360 +",(allocator<char> *)(disp_win_name.field_2._M_local_buf + 0xf)
            );
  cv::createTrackbar(local_320,local_2a8,(int *)0x0,height_max,OnTrackHeight,(void *)0x0);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)(disp_win_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"Disparity Image",&local_349);
  std::allocator<char>::~allocator(&local_349);
  bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
  if (bVar2) {
    cv::namedWindow(local_348,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_370,"Num Disp:  16 + 16 *",&local_371);
    cv::createTrackbar(local_370,local_348,(int *)0x0,ndisp_max,OnTrackNdisp,(void *)0x0);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_398,"Num Disp:  16 + 16 *",&local_399);
    cv::setTrackbarPos(local_398,local_348,ndisp_bar);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator(&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_3c0,"Blk   Size :     3  +  2 *",&local_3c1);
    cv::createTrackbar(local_3c0,local_348,(int *)0x0,wsize_max,OnTrackWsize,(void *)0x0);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_3e8,"Blk   Size :     3  +  2 *",&local_3e9);
    cv::setTrackbarPos(local_3e8,local_348,wsize_bar);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
  }
  cv::Mat::Mat(local_450);
  cv::Mat::Mat(local_4b0);
  cv::Mat::Mat(local_510);
  cv::Mat::Mat(local_570);
  do {
    if ((changed & 1U) != 0) {
      InitRectifyMap();
      changed = false;
    }
    if ((live & 1U) != 0) {
      cv::VideoCapture::operator>>(local_100,(Mat *)local_d0);
    }
    lVar5 = cv::Mat::total();
    if (lVar5 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Image capture error");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      cv::Rect_<int>::Rect_(&local_5e0,0,0,img_width,cap_rows);
      cv::Mat::operator()((Mat *)local_5d0,(Rect *)local_d0);
      cv::_OutputArray::_OutputArray(&local_5f8,local_450);
      cv::Mat::copyTo(local_5d0);
      cv::_OutputArray::~_OutputArray(&local_5f8);
      cv::Mat::~Mat((Mat *)local_5d0);
      cv::Rect_<int>::Rect_(&local_668,img_width,0,img_width,cap_rows);
      cv::Mat::operator()((Mat *)local_658,(Rect *)local_d0);
      cv::_OutputArray::_OutputArray(&local_680,local_4b0);
      cv::Mat::copyTo(local_658);
      cv::_OutputArray::~_OutputArray(&local_680);
      cv::Mat::~Mat((Mat *)local_658);
      cv::_InputArray::_InputArray(&local_698,local_450);
      cv::_OutputArray::_OutputArray(&local_6b0,local_510);
      cv::_InputArray::_InputArray(&local_6c8,(Mat *)smap);
      cv::_InputArray::_InputArray(&local_6e0,(Mat *)(smap + 0x60));
      cv::Scalar_<double>::Scalar_(&local_700);
      cv::remap(&local_698,&local_6b0,&local_6c8,&local_6e0,1,0,(Scalar_ *)&local_700);
      cv::_InputArray::~_InputArray(&local_6e0);
      cv::_InputArray::~_InputArray(&local_6c8);
      cv::_OutputArray::~_OutputArray(&local_6b0);
      cv::_InputArray::~_InputArray(&local_698);
      cv::_InputArray::_InputArray(&local_718,local_4b0);
      cv::_OutputArray::_OutputArray(&local_730,local_570);
      cv::_InputArray::_InputArray(&local_748,(Mat *)(smap + 0xc0));
      cv::_InputArray::_InputArray(&local_760,(Mat *)(smap + 0x120));
      cv::Scalar_<double>::Scalar_(&local_780);
      cv::remap(&local_718,&local_730,&local_748,&local_760,1,0,(Scalar_ *)&local_780);
      cv::_InputArray::~_InputArray(&local_760);
      cv::_InputArray::~_InputArray(&local_748);
      cv::_OutputArray::~_OutputArray(&local_730);
      cv::_InputArray::~_InputArray(&local_718);
    }
    else {
      cv::Mat::operator=(local_450,(Mat *)local_d0);
      cv::_InputArray::_InputArray(&local_798,(Mat *)local_d0);
      cv::_OutputArray::_OutputArray(&local_7b0,local_510);
      cv::_InputArray::_InputArray(&local_7c8,(Mat *)smap);
      cv::_InputArray::_InputArray(&local_7e0,(Mat *)(smap + 0x60));
      cv::Scalar_<double>::Scalar_(&local_800);
      cv::remap(&local_798,&local_7b0,&local_7c8,&local_7e0,1,0,(Scalar_ *)&local_800);
      cv::_InputArray::~_InputArray(&local_7e0);
      cv::_InputArray::~_InputArray(&local_7c8);
      cv::_OutputArray::~_OutputArray(&local_7b0);
      cv::_InputArray::~_InputArray(&local_798);
    }
    cv::Mat::Mat(local_860);
    cv::_InputArray::_InputArray(&local_878,local_450);
    cv::_OutputArray::_OutputArray(&local_890,local_860);
    cv::Size_<int>::Size_(&local_898);
    cv::resize(0x3fe0000000000000,&local_878,&local_890,&local_898,1);
    cv::_OutputArray::~_OutputArray(&local_890);
    cv::_InputArray::~_InputArray(&local_878);
    cv::_InputArray::_InputArray(&local_8b0,local_860);
    cv::imshow(local_2a8,&local_8b0);
    cv::_InputArray::~_InputArray(&local_8b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_8d0,"Rectified Image",&local_8d1);
    cv::_InputArray::_InputArray(&local_8f0,local_510);
    cv::imshow(local_8d0,&local_8f0);
    cv::_InputArray::~_InputArray(&local_8f0);
    std::__cxx11::string::~string(local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      cv::Mat::Mat(local_950);
      DisparityImage(local_510,local_570,local_950);
      cv::_InputArray::_InputArray((_InputArray *)local_968,local_950);
      cv::imshow(local_348,(_InputArray *)local_968);
      cv::_InputArray::~_InputArray((_InputArray *)local_968);
      cv::Mat::~Mat(local_950);
    }
    cVar3 = cv::waitKey(1);
    if (((cVar3 == 'q') || (cVar3 == 'Q')) || (cVar3 == '\x1b')) {
      local_970 = 3;
    }
    else {
      local_970 = 0;
    }
    cv::Mat::~Mat(local_860);
  } while (local_970 == 0);
  cv::Mat::~Mat(local_570);
  cv::Mat::~Mat(local_510);
  cv::Mat::~Mat(local_4b0);
  cv::Mat::~Mat(local_450);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_2a8);
  cv::VideoCapture::~VideoCapture(local_100);
  cv::Mat::~Mat((Mat *)local_d0);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::string file_name = argc == 2 ? argv[1] : "../astar_calicam.yml";
  LoadParameters(file_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread("../dasl_wood_shop.jpg", cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", img_width, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr, vfov_max, OnTrackAngle);
  cv::createTrackbar("Width:  480 +", param_win_name, nullptr, width_max, OnTrackWidth);
  cv::createTrackbar("Height: 360 +", param_win_name, nullptr, height_max, OnTrackHeight);

  std::string disp_win_name  = "Disparity Image";
  if (cam_model == "stereo") {
    cv::namedWindow(disp_win_name);
    cv::createTrackbar("Num Disp:  16 + 16 *", disp_win_name, nullptr, ndisp_max, OnTrackNdisp);
    cv::setTrackbarPos("Num Disp:  16 + 16 *", disp_win_name, ndisp_bar);
    cv::createTrackbar("Blk   Size :     3  +  2 *", disp_win_name, nullptr, wsize_max, OnTrackWsize);
    cv::setTrackbarPos("Blk   Size :     3  +  2 *", disp_win_name, wsize_bar);
  }

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    if (cam_model == "stereo") {
      raw_img(cv::Rect(        0, 0, img_width, cap_rows)).copyTo(raw_imgl);
      raw_img(cv::Rect(img_width, 0, img_width, cap_rows)).copyTo(raw_imgr);

      cv::remap(raw_imgl, rect_imgl, smap[0][0], smap[0][1], 1, 0);
      cv::remap(raw_imgr, rect_imgr, smap[1][0], smap[1][1], 1, 0);
    } else {
      raw_imgl = raw_img;
      cv::remap(raw_img, rect_imgl, smap[0][0], smap[0][1], 1, 0);
    }

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    if (cam_model == "stereo") {
      cv::Mat disp_img;
      DisparityImage(rect_imgl, rect_imgr, disp_img);
      imshow(disp_win_name,  disp_img);
    }

    char key = cv::waitKey(1);
    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}